

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O0

Status * __thiscall adios2::helper::Comm::Req::Wait(Req *this,string *hint)

{
  bool bVar1;
  pointer pCVar2;
  undefined8 in_RDX;
  Status *in_RDI;
  pointer in_stack_ffffffffffffffb8;
  Status *this_00;
  undefined8 local_28;
  size_t local_20;
  bool local_18;
  undefined8 local_10;
  
  this_00 = in_RDI;
  local_10 = in_RDX;
  Status::Status(in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
                      *)0x97f4b4);
  if (bVar1) {
    pCVar2 = std::
             unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
             ::operator->((unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
                           *)0x97f4c4);
    (*pCVar2->_vptr_CommReqImpl[2])(&local_28,pCVar2,local_10);
    this_00->Source = (undefined4)local_28;
    this_00->Tag = local_28._4_4_;
    this_00->Count = local_20;
    this_00->Cancelled = local_18;
    std::unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
    ::reset((unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
             *)this_00,in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

Comm::Status Comm::Req::Wait(const std::string &hint)
{
    Comm::Status status;
    if (m_Impl)
    {
        status = m_Impl->Wait(hint);
        m_Impl.reset();
    }
    return status;
}